

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HinOut.cpp
# Opt level: O0

void __thiscall HinOut::getData(HinOut *this,HModel *ptr_model)

{
  size_type sVar1;
  long in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000088;
  vector<double,_std::allocator<double>_> *in_stack_00000090;
  
  *(undefined4 *)(in_RDI + 0x7f0) = *(undefined4 *)(in_RSI + 0x60c);
  *(undefined4 *)(in_RDI + 0x7f4) = *(undefined4 *)(in_RSI + 0x610);
  *(int *)(in_RDI + 0x7f8) = *(int *)(in_RSI + 0x60c) + *(int *)(in_RSI + 0x610);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)in_stack_00000090,
             (vector<int,_std::allocator<int>_> *)in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000090,in_stack_00000088);
  sVar1 = std::vector<double,_std::allocator<double>_>::size
                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x830));
  *(int *)(in_RDI + 0x8c0) = (int)sVar1;
  return;
}

Assistant:

void HinOut::getData(HModel & ptr_model) {
	onumCol = ptr_model.numCol;
    onumRow = ptr_model.numRow;
    onumTot = ptr_model.numCol + ptr_model.numRow;
    oAstart = ptr_model.Astart;
    oAindex = ptr_model.Aindex;
    oAvalue = ptr_model.Avalue;
    ocolCost = ptr_model.colCost;
    ocolLower = ptr_model.colLower;
    ocolUpper = ptr_model.colUpper;
    orowLower = ptr_model.rowLower;
    orowUpper = ptr_model.rowUpper;

    oAcountX = oAvalue.size();
}